

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
duckdb::InternalException::InternalException<unsigned_long,int,int>
          (InternalException *this,string *msg,unsigned_long params,int params_1,int params_2)

{
  undefined4 in_register_0000000c;
  int in_R9D;
  string local_30;
  
  Exception::ConstructMessage<unsigned_long,int,int>
            (&local_30,(Exception *)msg,(string *)params,CONCAT44(in_register_0000000c,params_1),
             params_2,in_R9D);
  Exception::Exception(&this->super_Exception,INTERNAL,&local_30);
  *(undefined ***)&this->super_Exception = &PTR__runtime_error_0196eb60;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}